

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int selective_disable_cdf_rtc(AV1_COMP *cpi)

{
  int iVar1;
  
  iVar1 = (cpi->svc).number_temporal_layers;
  if (iVar1 == 1 && (cpi->svc).number_spatial_layers == 1) {
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      return 0;
    }
    iVar1 = is_frame_resize_pending(cpi);
    if (iVar1 != 0) {
      return 0;
    }
    if ((cpi->rc).high_source_sad != 0) {
      return 0;
    }
    if ((cpi->rc).frames_since_key < 0x1e) {
      return 0;
    }
    if (((cpi->oxcf).q_cfg.aq_mode == '\x03') &&
       (cpi->cyclic_refresh->counter_encode_maxq_scene_change < 0x1e)) {
      return 0;
    }
    if ((8 < cpi->frames_since_last_update) && ((cpi->rc).frame_source_sad != 0)) {
      return 0;
    }
  }
  else if (1 < iVar1) {
    return (uint)((cpi->svc).temporal_layer_id == iVar1 + -1);
  }
  return 1;
}

Assistant:

static inline int selective_disable_cdf_rtc(const AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  // For single layer.
  if (cpi->svc.number_spatial_layers == 1 &&
      cpi->svc.number_temporal_layers == 1) {
    // Don't disable on intra_only, scene change (high_source_sad = 1),
    // or resized frame. To avoid quality loss force enable at
    // for ~30 frames after key or scene/slide change, and
    // after 8 frames since last update if frame_source_sad > 0.
    if (frame_is_intra_only(cm) || is_frame_resize_pending(cpi) ||
        rc->high_source_sad || rc->frames_since_key < 30 ||
        (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
         cpi->cyclic_refresh->counter_encode_maxq_scene_change < 30) ||
        (cpi->frames_since_last_update > 8 && cpi->rc.frame_source_sad > 0))
      return 0;
    else
      return 1;
  } else if (cpi->svc.number_temporal_layers > 1) {
    // Disable only on top temporal enhancement layer for now.
    return cpi->svc.temporal_layer_id == cpi->svc.number_temporal_layers - 1;
  }
  return 1;
}